

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  ulong uVar1;
  bool bVar2;
  KeyValue *pKVar3;
  KeyValue *pKVar4;
  int in_ESI;
  ExtensionSet *in_RDI;
  KeyValue *it;
  KeyValue *end;
  int local_14 [2];
  ExtensionSet *in_stack_fffffffffffffff8;
  Extension *pEVar5;
  
  local_14[0] = in_ESI;
  unique0x100000a8 = in_RDI;
  bVar2 = is_large(in_RDI);
  if (bVar2) {
    uVar1 = (ulong)stack0xfffffffffffffff0 >> 0x20;
    pEVar5 = FindOrNullInLargeMap(in_stack_fffffffffffffff8,(int)uVar1);
  }
  else {
    pKVar3 = flat_end(in_RDI);
    pKVar4 = flat_begin(in_RDI);
    pKVar4 = std::
             lower_bound<google::protobuf::internal::ExtensionSet::KeyValue_const*,int,google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>
                       (pKVar4,pKVar3,local_14);
    if ((pKVar4 == pKVar3) || (pKVar4->first != local_14[0])) {
      pEVar5 = (Extension *)0x0;
    }
    else {
      pEVar5 = &pKVar4->second;
    }
  }
  return pEVar5;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) const {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    return FindOrNullInLargeMap(key);
  }
  const KeyValue* end = flat_end();
  const KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    return &it->second;
  }
  return NULL;
}